

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJWriter.cc
# Opt level: O3

size_t __thiscall OpenMesh::IO::_OBJWriter_::getMaterial(_OBJWriter_ *this,Vec4f _color)

{
  iterator __position;
  size_t sVar1;
  pointer pVVar2;
  float *pfVar3;
  long lVar4;
  undefined1 auStack_28 [8];
  Vec4f _color_local;
  
  _color_local.super_VectorDataT<float,_4>.field_0._0_8_ =
       _color.super_VectorDataT<float,_4>.field_0._8_8_;
  auStack_28 = _color.super_VectorDataT<float,_4>.field_0._0_8_;
  pVVar2 = (this->materialA_).
           super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->materialA_).
       super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)__position._M_current - (long)pVVar2;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    pfVar3 = (pVVar2->super_VectorDataT<float,_4>).field_0.m128 + 3;
    sVar1 = 0;
    do {
      if ((pfVar3[-3] == _color.super_VectorDataT<float,_4>.field_0._0_4_) &&
         (!NAN(pfVar3[-3]) && !NAN(_color.super_VectorDataT<float,_4>.field_0._0_4_))) {
        if ((pfVar3[-2] == _color.super_VectorDataT<float,_4>.field_0._4_4_) &&
           (!NAN(pfVar3[-2]) && !NAN(_color.super_VectorDataT<float,_4>.field_0._4_4_))) {
          if ((pfVar3[-1] == _color.super_VectorDataT<float,_4>.field_0._8_4_) &&
             (!NAN(pfVar3[-1]) && !NAN(_color.super_VectorDataT<float,_4>.field_0._8_4_))) {
            if ((*pfVar3 == _color.super_VectorDataT<float,_4>.field_0._12_4_) &&
               (!NAN(*pfVar3) && !NAN(_color.super_VectorDataT<float,_4>.field_0._12_4_))) {
              return sVar1;
            }
          }
        }
      }
      sVar1 = sVar1 + 1;
      pfVar3 = pfVar3 + 4;
    } while (lVar4 + (ulong)(lVar4 == 0) != sVar1);
  }
  if (__position._M_current ==
      (this->materialA_).
      super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::VectorT<float,4>,std::allocator<OpenMesh::VectorT<float,4>>>::
    _M_realloc_insert<OpenMesh::VectorT<float,4>const&>
              ((vector<OpenMesh::VectorT<float,4>,std::allocator<OpenMesh::VectorT<float,4>>> *)
               &this->materialA_,__position,(VectorT<float,_4> *)auStack_28);
    pVVar2 = (this->materialA_).
             super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(undefined1 (*) [8])&((__position._M_current)->super_VectorDataT<float,_4>).field_0 =
         auStack_28;
    *(undefined8 *)((long)&((__position._M_current)->super_VectorDataT<float,_4>).field_0 + 8) =
         _color_local.super_VectorDataT<float,_4>.field_0._0_8_;
    pVVar2 = (this->materialA_).
             super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->materialA_).
    super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  return ((long)pVVar2 -
          (long)(this->materialA_).
                super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
}

Assistant:

size_t _OBJWriter_::getMaterial(OpenMesh::Vec4f _color) const
{
  for (size_t i=0; i < materialA_.size(); i++)
    if(materialA_[i] == _color)
      return i;

  //not found add new material
  materialA_.push_back( _color );
  return materialA_.size()-1;
}